

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAcurv::VariablesQbIncrementPosition(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined8 in_XMM0_Qb;
  ChVector<double> new_rzz_dt;
  ChVector<double> new_ryy_dt;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_a0 [56];
  ChVector<double> new_rxx_dt;
  ChVectorRef local_48;
  undefined1 auVar7 [64];
  
  ChVariables::Get_qb((ChVectorRef *)&new_ryy_dt,
                      *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_a0,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&new_ryy_dt,
              0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&new_rxx_dt,local_a0,(type *)0x0);
  ChVariables::Get_qb((ChVectorRef *)&new_rzz_dt,
                      *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_a0,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&new_rzz_dt,
              3,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&new_ryy_dt,local_a0,(type *)0x0);
  ChVariables::Get_qb(&local_48,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_a0,&local_48,6,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&new_rzz_dt,local_a0,(type *)0x0);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = step;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = new_rxx_dt.m_data[2];
  auVar5 = vbroadcastsd_avx512f(auVar2);
  auVar5 = vpermi2pd_avx512f(_DAT_00e94180,
                             ZEXT2464(CONCAT816(auVar5._16_8_,new_rxx_dt.m_data._0_16_)),
                             ZEXT1664((undefined1  [16])new_ryy_dt.m_data._0_16_));
  dVar1 = (this->m_rzz).m_data[2];
  auVar6 = vbroadcastsd_avx512f(auVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = new_ryy_dt.m_data[2];
  auVar7 = vbroadcastsd_avx512f(auVar3);
  auVar8._0_40_ = auVar5._0_40_;
  auVar8._40_8_ = auVar7._40_8_;
  auVar8._48_8_ = auVar5._48_8_;
  auVar8._56_8_ = auVar5._56_8_;
  auVar5 = vinsertf32x4_avx512f(auVar8,(undefined1  [16])new_rzz_dt.m_data._0_16_,3);
  auVar5 = vmulpd_avx512f(auVar5,auVar6);
  auVar5 = vaddpd_avx512f(auVar5,*(undefined1 (*) [64])&(this->super_ChNodeFEAbase).field_0x20);
  *(undefined1 (*) [64])&(this->super_ChNodeFEAbase).field_0x20 = auVar5;
  (this->m_rzz).m_data[2] = step * new_rzz_dt.m_data[2] + dVar1;
  return;
}

Assistant:

void ChNodeFEAcurv::VariablesQbIncrementPosition(double step) {
    ChVector<> new_rxx_dt(m_variables->Get_qb().segment(0, 3));
    ChVector<> new_ryy_dt(m_variables->Get_qb().segment(3, 3));
    ChVector<> new_rzz_dt(m_variables->Get_qb().segment(6, 3));
    m_rxx = m_rxx + new_rxx_dt * step;
    m_ryy = m_ryy + new_ryy_dt * step;
    m_rzz = m_rzz + new_rzz_dt * step;
}